

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O1

string * sago::internal::getHome_abi_cxx11_(void)

{
  char *pcVar1;
  __uid_t __uid;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  runtime_error *prVar5;
  string *in_RDI;
  size_type __new_size;
  passwd *pw;
  vector<char,_std::allocator<char>_> buffer;
  passwd pwd;
  passwd *local_90;
  vector<char,_std::allocator<char>_> local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  passwd local_60;
  
  local_68 = &in_RDI->field_2;
  (in_RDI->_M_dataplus)._M_p = (pointer)local_68;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  __uid = getuid();
  pcVar3 = getenv("HOME");
  if (pcVar3 == (char *)0x0 || __uid == 0) {
    local_90 = (passwd *)0x0;
    sVar4 = sysconf(0x46);
    __new_size = 0x4000;
    if (0 < (long)sVar4) {
      __new_size = sVar4;
    }
    local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<char,_std::allocator<char>_>::resize(&local_88,__new_size);
    iVar2 = getpwuid_r(__uid,&local_60,
                       local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,&local_90);
    while (iVar2 == 0x22) {
      __new_size = __new_size * 2;
      std::vector<char,_std::allocator<char>_>::resize(&local_88,__new_size);
      iVar2 = getpwuid_r(__uid,&local_60,
                         local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start,&local_90);
    }
    if (iVar2 != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Unable to get passwd struct.");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar3 = local_90->pw_dir;
    if (pcVar3 == (char *)0x0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"User has no home directory");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = (char *)in_RDI->_M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,pcVar1,(ulong)pcVar3);
    if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    pcVar1 = (char *)in_RDI->_M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,pcVar1,(ulong)pcVar3);
  }
  return in_RDI;
}

Assistant:

std::string getHome() {
	std::string res;
	int uid = getuid();
	const char* homeEnv = std::getenv("HOME");
	if ( uid != 0 && homeEnv) {
		//We only acknowlegde HOME if not root.
		res = homeEnv;
		return res;
	}
	struct passwd* pw = nullptr;
	struct passwd pwd;
	long bufsize = sysconf(_SC_GETPW_R_SIZE_MAX);
	if (bufsize < 1) {
		bufsize = 16384;
	}
	std::vector<char> buffer;
	buffer.resize(bufsize);
	int error_code = getpwuid_r(uid, &pwd, buffer.data(), buffer.size(), &pw);
	while (error_code == ERANGE) {
		// The buffer was too small. Try again with a larger buffer.
		bufsize *= 2;
		buffer.resize(bufsize);
		error_code = getpwuid_r(uid, &pwd, buffer.data(), buffer.size(), &pw);
	}
	if (error_code) {
		throw std::runtime_error("Unable to get passwd struct.");
	}
	const char* tempRes = pw->pw_dir;
	if (!tempRes) {
		throw std::runtime_error("User has no home directory");
	}
	res = tempRes;
	return res;
}